

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_deconstruction.h
# Opt level: O2

CalAdxl345BusData * __thiscall
ximu::PacketDeconstruction::
deconstructCalAdxl345BusData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (CalAdxl345BusData *__return_storage_ptr__,PacketDeconstruction *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end)

{
  FourChannelData<ximu::Vector3<float>_> *pFVar1;
  Vector3<float> local_70;
  Vector3<float> local_64;
  Vector3<float> local_58;
  Vector3<float> local_4c;
  FourChannelData<ximu::Vector3<float>_> *local_40;
  float local_38;
  float local_34;
  
  local_40 = &__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>;
  local_38 = FixedFloat::toFloat((char)this[1],(char)this[2],CALIBRATED_ADXL_345);
  local_34 = FixedFloat::toFloat((char)this[3],(char)this[4],CALIBRATED_ADXL_345);
  local_70._z = FixedFloat::toFloat((char)this[5],(char)this[6],CALIBRATED_ADXL_345);
  local_70._x = local_38;
  local_70._y = local_34;
  local_38 = FixedFloat::toFloat((char)this[7],(char)this[8],CALIBRATED_ADXL_345);
  local_34 = FixedFloat::toFloat((char)this[9],(char)this[10],CALIBRATED_ADXL_345);
  local_64._z = FixedFloat::toFloat((char)this[0xb],(char)this[0xc],CALIBRATED_ADXL_345);
  local_64._x = local_38;
  local_64._y = local_34;
  local_38 = FixedFloat::toFloat((char)this[0xd],(char)this[0xe],CALIBRATED_ADXL_345);
  local_34 = FixedFloat::toFloat((char)this[0xf],(char)this[0x10],CALIBRATED_ADXL_345);
  local_58._z = FixedFloat::toFloat((char)this[0x11],(char)this[0x12],CALIBRATED_ADXL_345);
  local_58._x = local_38;
  local_58._y = local_34;
  local_38 = FixedFloat::toFloat((char)this[0x13],(char)this[0x14],CALIBRATED_ADXL_345);
  local_34 = FixedFloat::toFloat((char)this[0x15],(char)this[0x16],CALIBRATED_ADXL_345);
  local_4c._z = FixedFloat::toFloat((char)this[0x17],(char)this[0x18],CALIBRATED_ADXL_345);
  pFVar1 = local_40;
  local_4c._x = local_38;
  local_4c._y = local_34;
  FourChannelData<ximu::Vector3<float>_>::FourChannelData
            (local_40,&local_70,&local_64,&local_58,&local_4c);
  return (CalAdxl345BusData *)pFVar1;
}

Assistant:

static CalAdxl345BusData deconstructCalAdxl345BusData(
    InputIterator begin, InputIterator end)
  {
    return CalAdxl345BusData(
      Vector3f(
	FixedFloat::toFloat(begin[1],begin[2],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[3],begin[4],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[5],begin[6],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[7],begin[8],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[9],begin[10],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[11],begin[12],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[13],begin[14],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[15],begin[16],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[17],begin[18],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[19],begin[20],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[21],begin[22],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[23],begin[24],Qvals::CALIBRATED_ADXL_345)
      )
    );
  }